

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall
PField::PField(PField *this,FName *name,PType *type,DWORD flags,size_t offset,int bitvalue)

{
  uint uVar1;
  bool bVar2;
  PClass *pPVar3;
  int iVar4;
  PClass *pPVar5;
  uint uVar6;
  undefined4 extraout_var;
  
  iVar4 = name->Index;
  DObject::DObject((DObject *)this);
  *(int *)&(this->super_PSymbol).super_PTypeBase.super_DObject.field_0x24 = iVar4;
  (this->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006f3f58;
  this->Offset = offset;
  this->Type = type;
  this->Flags = flags;
  if (bitvalue == 0) {
    this->BitValue = -1;
  }
  else {
    iVar4 = 0;
    if (bitvalue != 1) {
      iVar4 = 0;
      do {
        iVar4 = iVar4 + 1;
        bVar2 = 3 < (uint)bitvalue;
        bitvalue = (uint)bitvalue >> 1;
      } while (bVar2);
    }
    this->BitValue = iVar4;
    pPVar3 = PInt::RegistrationInfo.MyClass;
    pPVar5 = (type->super_PTypeBase).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(type->super_PTypeBase).super_DObject._vptr_DObject)(type);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (type->super_PTypeBase).super_DObject.Class = pPVar5;
    }
    if ((pPVar5 == pPVar3) &&
       (uVar1 = this->BitValue,
       uVar1 < (uint)(*(int *)&(type->super_PTypeBase).super_DObject.field_0x24 << 3))) {
      uVar6 = uVar1 + 7;
      if (-1 < (int)uVar1) {
        uVar6 = uVar1;
      }
      this->Offset = this->Offset + (long)((int)uVar6 >> 3);
      this->BitValue = uVar1 & 7;
      this->Type = (PType *)TypeBool;
    }
    else {
      I_Error("Trying to create an invalid bit field element: %s",
              FName::NameData.NameArray[name->Index].Text);
    }
  }
  return;
}

Assistant:

PField::PField(FName name, PType *type, DWORD flags, size_t offset, int bitvalue)
	: PSymbol(name), Offset(offset), Type(type), Flags(flags)
{
	if (bitvalue != 0)
	{
		BitValue = 0;
		unsigned val = bitvalue;
		while ((val >>= 1)) BitValue++;

		if (type->IsA(RUNTIME_CLASS(PInt)) && unsigned(BitValue) < 8u * type->Size)
		{
			// map to the single bytes in the actual variable. The internal bit instructions operate on 8 bit values.
#ifndef __BIG_ENDIAN__
			Offset += BitValue / 8;
#else
			Offset += type->Size - 1 - BitValue / 8;
#endif
			BitValue &= 7;
			Type = TypeBool;
		}
		else
		{
			// Just abort. Bit fields should only be defined internally.
			I_Error("Trying to create an invalid bit field element: %s", name.GetChars());
		}
	}
	else BitValue = -1;
}